

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall FIX::HttpServer::onStart(HttpServer *this)

{
  SocketServer *this_00;
  bool bVar1;
  int __fd;
  HttpServer *in_RSI;
  
  do {
    __fd = (int)in_RSI;
    if ((this->m_stop != false) || (this->m_pServer == (SocketServer *)0x0)) break;
    in_RSI = this;
    bVar1 = SocketServer::block(this->m_pServer,&this->super_Strategy,false,0.0);
    __fd = (int)in_RSI;
  } while (bVar1);
  if (this->m_pServer != (SocketServer *)0x0) {
    SocketServer::close(this->m_pServer,__fd);
    this_00 = this->m_pServer;
    if (this_00 != (SocketServer *)0x0) {
      SocketMonitor::~SocketMonitor(&this_00->m_monitor);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree(&(this_00->m_portToInfo)._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
                   *)this_00);
      operator_delete(this_00,0x160);
    }
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void HttpServer::onStart() {
  while (!m_stop && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}